

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O3

bool __thiscall
cmLocalUnixMakefileGenerator3::UpdateDependencies
          (cmLocalUnixMakefileGenerator3 *this,string *tgtInfo,bool verbose,bool color)

{
  char *pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  cmFileTimeCache *this_00;
  pointer pcVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  ostream *poVar7;
  string *psVar8;
  bool bVar9;
  string internalDependFile;
  int result;
  DependencyMap validDependencies;
  int result_1;
  string dependFile;
  string targetDir;
  ostringstream msg;
  string local_658;
  string local_638;
  undefined1 local_618 [32];
  _Base_ptr local_5f8;
  size_t local_5f0;
  int local_5e4;
  string local_5e0;
  string local_5c0;
  undefined1 local_5a0 [112];
  ios_base local_530 [1280];
  
  bVar4 = cmMakefile::ReadListFile
                    ((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile,tgtInfo);
  if ((((!bVar4) || (cmSystemTools::s_ErrorOccured != false)) ||
      (cmSystemTools::s_FatalErrorOccured != false)) ||
     (bVar4 = cmSystemTools::GetInterruptFlag(), bVar4)) {
    local_5a0._0_8_ = local_5a0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_5a0,"Target DependInfo.cmake file not found","");
    cmSystemTools::Error((string *)local_5a0);
    if ((undefined1 *)local_5a0._0_8_ != local_5a0 + 0x10) {
      operator_delete((void *)local_5a0._0_8_,CONCAT71(local_5a0._17_7_,local_5a0[0x10]) + 1);
    }
  }
  CheckMultipleOutputs(this,verbose);
  cmsys::SystemTools::GetFilenamePath(&local_5c0,tgtInfo);
  local_658._M_dataplus._M_p = (pointer)&local_658.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_658,local_5c0._M_dataplus._M_p,
             local_5c0._M_dataplus._M_p + local_5c0._M_string_length);
  std::__cxx11::string::append((char *)&local_658);
  local_5e0._M_dataplus._M_p = (pointer)&local_5e0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_5e0,local_5c0._M_dataplus._M_p,
             local_5c0._M_dataplus._M_p + local_5c0._M_string_length);
  std::__cxx11::string::append((char *)&local_5e0);
  this_00 = (((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
             CMakeInstance->FileTimeCache)._M_t.
            super___uniq_ptr_impl<cmFileTimeCache,_std::default_delete<cmFileTimeCache>_>._M_t.
            super__Tuple_impl<0UL,_cmFileTimeCache_*,_std::default_delete<cmFileTimeCache>_>.
            super__Head_base<0UL,_cmFileTimeCache_*,_false>._M_head_impl;
  bVar4 = cmFileTimeCache::Compare(this_00,&local_658,tgtInfo,(int *)&local_638);
  bVar9 = -1 < (int)local_638._M_dataplus._M_p;
  if (verbose && (!bVar4 || !bVar9)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5a0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5a0,"Dependee \"",10);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_5a0,(tgtInfo->_M_dataplus)._M_p,tgtInfo->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\" is newer than depender \"",0x1a);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_658._M_dataplus._M_p,local_658._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\".",2);
    std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    cmSystemTools::Stdout((string *)local_618);
    if ((undefined1 *)local_618._0_8_ != local_618 + 0x10) {
      operator_delete((void *)local_618._0_8_,local_618._16_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5a0);
    std::ios_base::~ios_base(local_530);
  }
  psVar8 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
  pcVar1 = local_618 + 0x10;
  pcVar3 = (psVar8->_M_dataplus)._M_p;
  local_618._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_618,pcVar3,pcVar3 + psVar8->_M_string_length);
  std::__cxx11::string::append(local_618);
  std::__cxx11::string::append(local_618);
  bVar5 = cmFileTimeCache::Compare(this_00,&local_658,(string *)local_618,&local_5e4);
  if (bVar5 && -1 < local_5e4) {
    if ((char *)local_618._0_8_ != pcVar1) {
      operator_delete((void *)local_618._0_8_,local_618._16_8_ + 1);
    }
    local_618._24_8_ = local_618 + 8;
    local_618._8_4_ = _S_red;
    local_618._16_8_ = 0;
    local_5f0 = 0;
    local_5f8 = (_Base_ptr)local_618._24_8_;
    cmDependsC::cmDependsC((cmDependsC *)local_5a0);
    local_5a0[0x10] = verbose;
    local_5a0._24_8_ = this_00;
    bVar5 = cmDepends::Check((cmDepends *)local_5a0,&local_5e0,&local_658,(DependencyMap *)local_618
                            );
    cmDependsC::~cmDependsC((cmDependsC *)local_5a0);
    bVar6 = true;
    if ((bVar4 && bVar9) && bVar5) goto LAB_0031fa65;
  }
  else {
    if (verbose) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5a0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5a0,"Dependee \"",10);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_5a0,(char *)local_618._0_8_,
                          CONCAT44(local_618._12_4_,local_618._8_4_));
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\" is newer than depender \"",0x1a)
      ;
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_658._M_dataplus._M_p,local_658._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\".",2);
      std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      std::__cxx11::stringbuf::str();
      cmSystemTools::Stdout(&local_638);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_638._M_dataplus._M_p != &local_638.field_2) {
        operator_delete(local_638._M_dataplus._M_p,local_638.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5a0);
      std::ios_base::~ios_base(local_530);
    }
    if ((char *)local_618._0_8_ != pcVar1) {
      operator_delete((void *)local_618._0_8_,local_618._16_8_ + 1);
    }
    local_618._24_8_ = local_618 + 8;
    local_618._8_4_ = _S_red;
    local_618._16_8_ = 0;
    local_5f0 = 0;
    local_5f8 = (_Base_ptr)local_618._24_8_;
  }
  cmsys::SystemTools::GetFilenameName((string *)local_5a0,&local_5c0);
  std::__cxx11::string::substr((ulong)&local_638,(ulong)local_5a0);
  std::__cxx11::string::operator=((string *)local_5a0,(string *)&local_638);
  paVar2 = &local_638.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_638._M_dataplus._M_p != paVar2) {
    operator_delete(local_638._M_dataplus._M_p,local_638.field_2._M_allocated_capacity + 1);
  }
  local_638._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_638,"Scanning dependencies of target ","");
  std::__cxx11::string::_M_append((char *)&local_638,local_5a0._0_8_);
  cmSystemTools::MakefileColorEcho(0x106,local_638._M_dataplus._M_p,true,color);
  bVar6 = ScanDependencies(this,&local_5c0,&local_5e0,&local_658,(DependencyMap *)local_618);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_638._M_dataplus._M_p != paVar2) {
    operator_delete(local_638._M_dataplus._M_p,local_638.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_5a0._0_8_ != local_5a0 + 0x10) {
    operator_delete((void *)local_5a0._0_8_,CONCAT71(local_5a0._17_7_,local_5a0[0x10]) + 1);
  }
LAB_0031fa65:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               *)local_618);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e0._M_dataplus._M_p != &local_5e0.field_2) {
    operator_delete(local_5e0._M_dataplus._M_p,local_5e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_658._M_dataplus._M_p != &local_658.field_2) {
    operator_delete(local_658._M_dataplus._M_p,local_658.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c0._M_dataplus._M_p != &local_5c0.field_2) {
    operator_delete(local_5c0._M_dataplus._M_p,local_5c0.field_2._M_allocated_capacity + 1);
  }
  return bVar6;
}

Assistant:

bool cmLocalUnixMakefileGenerator3::UpdateDependencies(
  const std::string& tgtInfo, bool verbose, bool color)
{
  // read in the target info file
  if (!this->Makefile->ReadListFile(tgtInfo) ||
      cmSystemTools::GetErrorOccuredFlag()) {
    cmSystemTools::Error("Target DependInfo.cmake file not found");
  }

  // Check if any multiple output pairs have a missing file.
  this->CheckMultipleOutputs(verbose);

  std::string const targetDir = cmSystemTools::GetFilenamePath(tgtInfo);
  std::string const internalDependFile = targetDir + "/depend.internal";
  std::string const dependFile = targetDir + "/depend.make";

  // If the target DependInfo.cmake file has changed since the last
  // time dependencies were scanned then force rescanning.  This may
  // happen when a new source file is added and CMake regenerates the
  // project but no other sources were touched.
  bool needRescanDependInfo = false;
  cmFileTimeCache* ftc =
    this->GlobalGenerator->GetCMakeInstance()->GetFileTimeCache();
  {
    int result;
    if (!ftc->Compare(internalDependFile, tgtInfo, &result) || result < 0) {
      if (verbose) {
        std::ostringstream msg;
        msg << "Dependee \"" << tgtInfo << "\" is newer than depender \""
            << internalDependFile << "\"." << std::endl;
        cmSystemTools::Stdout(msg.str());
      }
      needRescanDependInfo = true;
    }
  }

  // If the directory information is newer than depend.internal, include dirs
  // may have changed. In this case discard all old dependencies.
  bool needRescanDirInfo = false;
  {
    std::string dirInfoFile = this->GetCurrentBinaryDirectory();
    dirInfoFile += "/CMakeFiles";
    dirInfoFile += "/CMakeDirectoryInformation.cmake";
    int result;
    if (!ftc->Compare(internalDependFile, dirInfoFile, &result) ||
        result < 0) {
      if (verbose) {
        std::ostringstream msg;
        msg << "Dependee \"" << dirInfoFile << "\" is newer than depender \""
            << internalDependFile << "\"." << std::endl;
        cmSystemTools::Stdout(msg.str());
      }
      needRescanDirInfo = true;
    }
  }

  // Check the implicit dependencies to see if they are up to date.
  // The build.make file may have explicit dependencies for the object
  // files but these will not affect the scanning process so they need
  // not be considered.
  cmDepends::DependencyMap validDependencies;
  bool needRescanDependencies = false;
  if (!needRescanDirInfo) {
    cmDependsC checker;
    checker.SetVerbose(verbose);
    checker.SetFileTimeCache(ftc);
    // cmDependsC::Check() fills the vector validDependencies() with the
    // dependencies for those files where they are still valid, i.e. neither
    // the files themselves nor any files they depend on have changed.
    // We don't do that if the CMakeDirectoryInformation.cmake file has
    // changed, because then potentially all dependencies have changed.
    // This information is given later on to cmDependsC, which then only
    // rescans the files where it did not get valid dependencies via this
    // dependency vector. This means that in the normal case, when only
    // few or one file have been edited, then also only this one file is
    // actually scanned again, instead of all files for this target.
    needRescanDependencies =
      !checker.Check(dependFile, internalDependFile, validDependencies);
  }

  if (needRescanDependInfo || needRescanDirInfo || needRescanDependencies) {
    // The dependencies must be regenerated.
    std::string targetName = cmSystemTools::GetFilenameName(targetDir);
    targetName = targetName.substr(0, targetName.length() - 4);
    std::string message = "Scanning dependencies of target ";
    message += targetName;
    cmSystemTools::MakefileColorEcho(cmsysTerminal_Color_ForegroundMagenta |
                                       cmsysTerminal_Color_ForegroundBold,
                                     message.c_str(), true, color);

    return this->ScanDependencies(targetDir, dependFile, internalDependFile,
                                  validDependencies);
  }

  // The dependencies are already up-to-date.
  return true;
}